

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFFormValue.cpp
# Opt level: O2

Optional<llvm::DWARFFormValue::UnitOffset> * __thiscall
llvm::DWARFFormValue::getAsRelativeReference
          (Optional<llvm::DWARFFormValue::UnitOffset> *__return_storage_ptr__,DWARFFormValue *this)

{
  Form FVar1;
  anon_union_8_3_82d75f4a_for_ValueType_0 aVar2;
  bool bVar3;
  
  bVar3 = isFormClass(this,FC_Reference);
  if (bVar3) {
    FVar1 = this->Form;
    if (FVar1 - 0x11 < 5) {
      if (this->U == (DWARFUnit *)0x0) goto LAB_00b41dd3;
      aVar2 = (this->Value).field_0;
      (__return_storage_ptr__->Storage).field_0.value.Unit = this->U;
      (__return_storage_ptr__->Storage).field_0.value.Offset = (uint64_t)aVar2;
    }
    else {
      if (((FVar1 != DW_FORM_ref_addr) && (FVar1 != DW_FORM_ref_sig8)) &&
         (FVar1 != DW_FORM_GNU_ref_alt)) goto LAB_00b41dd3;
      aVar2 = (this->Value).field_0;
      (__return_storage_ptr__->Storage).field_0.value.Unit = (DWARFUnit *)0x0;
      (__return_storage_ptr__->Storage).field_0.value.Offset = (uint64_t)aVar2;
    }
    bVar3 = true;
  }
  else {
LAB_00b41dd3:
    (__return_storage_ptr__->Storage).field_0.empty = '\0';
    bVar3 = false;
  }
  (__return_storage_ptr__->Storage).hasVal = bVar3;
  return __return_storage_ptr__;
}

Assistant:

Optional<DWARFFormValue::UnitOffset> DWARFFormValue::getAsRelativeReference() const {
  if (!isFormClass(FC_Reference))
    return None;
  switch (Form) {
  case DW_FORM_ref1:
  case DW_FORM_ref2:
  case DW_FORM_ref4:
  case DW_FORM_ref8:
  case DW_FORM_ref_udata:
    if (!U)
      return None;
    return UnitOffset{const_cast<DWARFUnit*>(U), Value.uval};
  case DW_FORM_ref_addr:
  case DW_FORM_ref_sig8:
  case DW_FORM_GNU_ref_alt:
    return UnitOffset{nullptr, Value.uval};
  default:
    return None;
  }
}